

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

string_view __thiscall
wabt::anon_unknown_11::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer pbVar7;
  pointer pcVar8;
  size_t __n;
  string_view sVar9;
  
  if (var->type_ == Index) {
    pbVar7 = (this->labels_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->labels_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7;
    __n = 0;
    pcVar8 = (pointer)0x0;
    if ((ulong)(var->field_2).index_ < (ulong)(lVar5 >> 5)) {
      lVar6 = ~(ulong)(var->field_2).index_ * 0x20;
      pcVar8 = *(pointer *)((long)pbVar7 + lVar6 + lVar5);
      __n = *(size_t *)((long)pbVar7 + lVar6 + 8 + lVar5);
    }
  }
  else {
    if (var->type_ != Name) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    pbVar7 = (this->labels_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (int)((ulong)((long)(this->labels_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7) >> 5) - 1
    ;
    if ((int)uVar3 < 0) {
      __n = 0;
      pcVar8 = (pointer)0x0;
    }
    else {
      sVar1 = (var->field_2).name_._M_string_length;
      pbVar7 = pbVar7 + uVar3;
      pcVar8 = (pointer)0x0;
      lVar5 = (ulong)uVar3 + 1;
      do {
        __n = pbVar7->_M_string_length;
        if (__n == sVar1) {
          if (__n != 0) {
            iVar4 = bcmp((pbVar7->_M_dataplus)._M_p,(var->field_2).name_._M_dataplus._M_p,__n);
            if (iVar4 != 0) goto LAB_00117766;
          }
          pcVar8 = (pbVar7->_M_dataplus)._M_p;
          goto LAB_001177be;
        }
LAB_00117766:
        pbVar7 = pbVar7 + -1;
        lVar6 = lVar5 + -1;
        bVar2 = 0 < lVar5;
        lVar5 = lVar6;
      } while (lVar6 != 0 && bVar2);
      __n = 0;
    }
  }
LAB_001177be:
  sVar9._M_str = pcVar8;
  sVar9._M_len = __n;
  return sVar9;
}

Assistant:

std::string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return std::string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return std::string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}